

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

void fn_build_full_path(char *buf,size_t buflen,char *dir,char *fname,int literal)

{
  char cVar1;
  char *__s;
  int iVar2;
  size_t sVar3;
  undefined8 *puVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  iVar2 = CVmNetFile::is_net_mode();
  if (iVar2 == 0) {
    if (literal == 0) {
      os_build_full_path(buf,buflen,dir,fname);
      return;
    }
    os_combine_paths(buf,buflen,dir,fname);
    return;
  }
  if (*fname == '/') {
    if (buflen != 0) {
      sVar3 = strlen(fname);
      uVar7 = buflen - 1;
      if (sVar3 <= buflen - 1) {
        uVar7 = sVar3;
      }
      memcpy(buf,fname,uVar7);
      buf[uVar7] = '\0';
    }
  }
  else {
    sVar3 = strlen(dir);
    if (sVar3 == 0) {
      pcVar5 = "/";
    }
    else {
      pcVar5 = "/";
      if (dir[sVar3 - 1] == '/') {
        pcVar5 = "";
      }
    }
    t3sprintf(buf,buflen,"%s%s%s",dir,pcVar5,fname);
  }
  if (literal == 0) {
    cVar1 = *buf;
    sVar3 = strlen(buf);
    uVar8 = 0;
    puVar4 = (undefined8 *)operator_new__(-(ulong)(sVar3 >> 0x3d != 0) | sVar3 * 8);
    pcVar5 = strtok(buf,"/");
    *puVar4 = pcVar5;
    uVar7 = 0;
    if (pcVar5 != (char *)0x0) {
      uVar7 = 0;
      do {
        pcVar5 = strtok((char *)0x0,"/");
        puVar4[uVar7 + 1] = pcVar5;
        uVar7 = uVar7 + 1;
      } while (pcVar5 != (char *)0x0);
    }
    if ((int)uVar7 != 0) {
      uVar9 = 0;
      uVar8 = 0;
      do {
        pcVar5 = (char *)puVar4[uVar9];
        if ((*pcVar5 != '\0') && (iVar2 = strcmp(pcVar5,"."), iVar2 != 0)) {
          iVar2 = strcmp(pcVar5,"..");
          if ((iVar2 == 0) &&
             ((0 < (int)uVar8 && (iVar2 = strcmp((char *)puVar4[(ulong)uVar8 - 1],".."), iVar2 != 0)
              ))) {
            uVar8 = uVar8 - 1;
          }
          else {
            lVar6 = (long)(int)uVar8;
            uVar8 = uVar8 + 1;
            puVar4[lVar6] = pcVar5;
          }
        }
        uVar9 = uVar9 + 1;
      } while ((uVar7 & 0xffffffff) != uVar9);
    }
    pcVar5 = buf;
    if (cVar1 == '/') {
      pcVar5 = buf + 1;
      *buf = '/';
    }
    if (0 < (int)uVar8) {
      uVar7 = 1;
      do {
        __s = (char *)puVar4[uVar7 - 1];
        sVar3 = strlen(__s);
        memcpy(pcVar5,__s,sVar3);
        pcVar5 = pcVar5 + sVar3;
        if (uVar7 < uVar8) {
          *pcVar5 = '/';
          pcVar5 = pcVar5 + 1;
        }
        bVar10 = uVar7 != uVar8;
        uVar7 = uVar7 + 1;
      } while (bVar10);
    }
    *pcVar5 = '\0';
    if (*buf == '\0') {
      buf[0] = '.';
      buf[1] = '\0';
    }
    operator_delete__(puVar4);
    return;
  }
  return;
}

Assistant:

static void fn_build_full_path(
    VMG_ char *buf, size_t buflen,
    const char *dir, const char *fname, int literal)
{
    if (CVmNetFile::is_net_mode(vmg0_))
    {
        /* 
         *   Network storage mode - use Unix rules.  First, if the filename
         *   is in absolute format already, use it unchanged.  If not, append
         *   the filename to the directory, adding a '/' between the two if
         *   the directory doesn't already end with a slash.
         */
        if (fname[0] == '/')
        {
            /* the file is absolute - return it unchanged */
            lib_strcpy(buf, buflen, fname);
        }
        else
        {
            /* note the last character of the directory path */
            size_t dirlen = strlen(dir);
            char dirlast = dirlen != 0 ? dir[dirlen-1] : 0;

            /* build the result */
            t3sprintf(buf, buflen, "%s%s%s",
                      dir, dirlast == '/' ? "" : "/", fname);
        }

        /* if not in literal mode, canonicalize the result */
        if (!literal)
            nf_canonicalize(buf);
    }
    else
    {
        /* local storage mode - use local OS rules */
        if (literal)
            os_combine_paths(buf, buflen, dir, fname);
        else
            os_build_full_path(buf, buflen, dir, fname);
    }
}